

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

int __thiscall
Random_keys::avancaGeracaoesAdaptativo2
          (Random_keys *this,Graph *g,int it_s_melhora,float maxMutacao,float max_pct,
          float taxaTamMut,float taxaPctMut)

{
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_00;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_01;
  double dVar1;
  value_type pRVar2;
  RK_Individual *pai1;
  RK_Individual *pai2;
  int iVar3;
  reference ppRVar4;
  uint *puVar5;
  uint uVar6;
  size_type sVar7;
  size_type __n;
  uint uVar8;
  Random_keys *pRVar9;
  uint uVar10;
  int iVar11;
  unsigned_long i;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  float fVar15;
  float fVar16;
  vector<int,_std::allocator<int>_> chamadaGeracao;
  double local_c8;
  int local_c0;
  int local_bc;
  double local_b8;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  int local_9c;
  int local_98;
  int local_94;
  Graph *local_90;
  _Vector_base<int,_std::allocator<int>_> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  long local_40;
  size_type local_38;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->popAtual;
  local_ac = maxMutacao;
  local_a8 = max_pct;
  local_a4 = taxaTamMut;
  local_a0 = taxaPctMut;
  local_9c = it_s_melhora;
  ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (this_00,(long)this->tamPop - 1);
  pRVar2 = *ppRVar4;
  ordenaPopulacaoAtual(this,g);
  local_c8 = pRVar2->active_loss * 100000.0;
  this_01 = &this->popAnterior;
  local_58 = 0x3d4ccccd;
  uStack_50 = 0;
  local_68 = 0x3dcccccd;
  uStack_60 = 0;
  local_bc = 0;
  iVar11 = 0;
  local_90 = g;
  for (local_c0 = 0; local_c0 < this->numGeracoes; local_c0 = local_c0 + 1) {
    ordenaPopulacaoAtual(this,local_90);
    ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (this_00,(long)this->tamPop - 1);
    local_b8 = (*ppRVar4)->active_loss * 100000.0;
    if (local_c8 <= local_b8) {
      iVar11 = iVar11 + 1;
    }
    else {
      iVar11 = 0;
      local_bc = local_c0;
    }
    if (iVar11 == local_9c) {
      fVar15 = (float)(~-(uint)((float)local_58 < local_ac) & (uint)(float)local_58 |
                      (uint)((float)local_58 * local_a4) & -(uint)((float)local_58 < local_ac));
      fVar16 = (float)(~-(uint)((float)local_68 < local_a8) & (uint)(float)local_68 |
                      (uint)((float)local_68 * local_a0) & -(uint)((float)local_68 < local_a8));
      local_68 = CONCAT44(local_68._4_4_,fVar16);
      iVar11 = 0;
      local_58 = CONCAT44(local_58._4_4_,fVar15);
      if ((fVar16 < local_a8) || (fVar15 < local_ac)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_88,&local_c0);
      }
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=(this_01,this_00);
    iVar3 = this->tamPop;
    uVar6 = (uint)((double)iVar3 * 0.05);
    local_48 = (ulong)uVar6;
    local_94 = (int)((double)iVar3 * 0.1);
    uVar13 = SUB84(local_b8,0);
    uVar14 = (undefined4)((ulong)local_b8 >> 0x20);
    if (local_c8 <= local_b8) {
      uVar13 = SUB84(local_c8,0);
      uVar14 = (undefined4)((ulong)local_c8 >> 0x20);
    }
    local_b8 = (double)CONCAT44(uVar14,uVar13);
    local_40 = (long)(int)(uVar6 * 5);
    local_98 = iVar11;
    for (sVar7 = (size_type)(int)uVar6; iVar11 = local_98, (long)sVar7 < (long)(iVar3 - local_94);
        sVar7 = sVar7 + 1) {
      local_38 = sVar7;
      rand();
      iVar11 = rand();
      uVar10 = iVar11 % this->tamPop;
      iVar11 = rand();
      uVar6 = iVar11 % this->tamPop;
      iVar11 = rand();
      uVar8 = iVar11 % this->tamPop;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar10);
      dVar1 = (*ppRVar4)->active_loss;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar6);
      if (dVar1 < (*ppRVar4)->active_loss) {
        uVar6 = uVar10;
      }
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar6);
      dVar1 = (*ppRVar4)->active_loss;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar8);
      if (dVar1 < (*ppRVar4)->active_loss) {
        uVar8 = uVar6;
      }
      uVar12 = (ulong)uVar8;
      while ((uint)uVar12 == uVar8) {
        iVar11 = rand();
        uVar12 = (long)iVar11 % (long)this->tamPop & 0xffffffff;
      }
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar8);
      sVar7 = local_38;
      pai1 = *ppRVar4;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)(uint)uVar12);
      pai2 = *ppRVar4;
      pRVar9 = (Random_keys *)this_00;
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar7);
      cruzamento2(pRVar9,pai1,pai2,*ppRVar4);
      if (local_40 < (long)sVar7) {
        pRVar9 = (Random_keys *)this_00;
        ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar7);
        mutacao(pRVar9,*ppRVar4);
      }
      else {
        pRVar9 = (Random_keys *)this_00;
        ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar7);
        mutacaoAdaptavitva(pRVar9,*ppRVar4,(float)local_58,(float)local_68);
      }
      iVar3 = this->tamPop;
    }
    sVar7 = local_48 & 0xffffffff;
    if ((int)local_48 < 1) {
      sVar7 = 0;
    }
    for (__n = 0; sVar7 != __n; __n = __n + 1) {
      ppRVar4 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,__n);
      RK_Individual::generate_random_weights(*ppRVar4);
    }
    local_c8 = local_b8;
  }
  ordenaPopulacaoAtual(this,local_90);
  for (uVar12 = 0;
      uVar12 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar12 = uVar12 + 1) {
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::at
                               ((vector<int,_std::allocator<int>_> *)&local_88,uVar12);
    printf("%d,",(ulong)*puVar5);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return local_bc;
}

Assistant:

int
Random_keys::avancaGeracaoesAdaptativo2(Graph *g, int it_s_melhora, float maxMutacao, float max_pct, float taxaTamMut,
                                        float taxaPctMut) {

    int it=0;
    vector<int> chamadaGeracao;

    ///parametros da mutacao adaptativa
    float tamMutacao = 0.05;
    float pctMutacao = 0.1;
    ///--------------------------------

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
         e ordena a populacao da maior perda(pior individuo)
         pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
            it=0;
        }else{
            it++;
        }

        if(it==it_s_melhora){
            if(tamMutacao<maxMutacao)
                tamMutacao*=taxaTamMut;
            if(pctMutacao<max_pct)
                pctMutacao*=taxaPctMut;
            if(pctMutacao<max_pct || tamMutacao<maxMutacao){
                chamadaGeracao.push_back(k);
//                printf("(%f, %f)", tamMutacao, pctMutacao);
            }
            it=0;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /*torneio com 3*/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            int aux = cand1;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }else{aux = cand2;}
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }else{aux = cand3;}
            pai1 = aux;

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia2(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento2(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();

            if(i<=5*num_piores)
                this->mutacaoAdaptavitva(popAtual.at(i), tamMutacao, pctMutacao);
            else
                this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

//    cout << "\n--------------------------------------"<<endl;
//    for(unsigned int i=0; i<popAtual.size(); i++)
//        cout << 100*1000*popAtual.at(i)->getPerdaAtiva() << " , ";
//    cout << "\n--------------------------------------"<<endl;

    this->ordenaPopulacaoAtual(g);

    for(unsigned long int i=0; i<chamadaGeracao.size();i++)
        printf("%d,", chamadaGeracao.at(i));

    return melhorGeracao;
}